

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkComputeSupportsNaive(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  size_t __nmemb;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_40;
  Vec_Ptr_t *local_38;
  
  local_38 = pNtk->vCis;
  uVar9 = local_38->nSize;
  if (0 < (long)(int)uVar9) {
    ppvVar3 = local_38->pArray;
    pAVar6 = (Abc_Obj_t *)0x0;
    do {
      local_40 = (Abc_Obj_t *)ppvVar3[(long)pAVar6];
      local_40->pNext = pAVar6;
      pAVar6 = (Abc_Obj_t *)((long)&pAVar6->pNtk + 1);
    } while ((Abc_Obj_t *)(long)(int)uVar9 != pAVar6);
  }
  pVVar4 = pNtk->vCos;
  uVar1 = pVVar4->nSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar1 - 1) {
    uVar12 = (ulong)uVar1;
  }
  pVVar2->nSize = 0;
  iVar8 = (int)uVar12;
  pVVar2->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pVVar7 = local_38;
  if (0 < (int)uVar1) {
    iVar8 = 0;
    lVar10 = 0;
    do {
      local_40 = (Abc_Obj_t *)pVVar4->pArray[lVar10];
      if ((*(uint *)((long)local_40->pNtk->vObjs->pArray[*(local_40->vFanins).pArray] + 0x14) & 0xf)
          == 7) {
        pVVar4 = Abc_NtkNodeSupport(pNtk,&local_40,1);
        __nmemb = (size_t)pVVar4->nSize;
        ppvVar3 = pVVar4->pArray;
        if (0 < (long)__nmemb) {
          lVar5 = 0;
          do {
            *(undefined4 *)((long)ppvVar3 + lVar5 * 4) = *(undefined4 *)((long)ppvVar3[lVar5] + 8);
            lVar5 = lVar5 + 1;
            __nmemb = (size_t)pVVar4->nSize;
          } while (lVar5 < (long)__nmemb);
        }
        qsort(ppvVar3,__nmemb,4,Vec_IntSortCompare1);
        Vec_IntPush((Vec_Int_t *)pVVar4,(int)lVar10);
        iVar11 = (int)uVar12;
        if (iVar8 == iVar11) {
          if (iVar11 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar12 = 0x10;
          }
          else {
            uVar12 = (ulong)(uint)(iVar11 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar12 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar12 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar11 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar5 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar2->nSize = iVar8;
        ppvVar3[lVar5] = pVVar4;
        pVVar4 = pNtk->vCos;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar4->nSize);
    uVar9 = pNtk->vCis->nSize;
    pVVar7 = pNtk->vCis;
  }
  if (0 < (int)uVar9) {
    ppvVar3 = pVVar7->pArray;
    uVar12 = 0;
    do {
      local_40 = (Abc_Obj_t *)ppvVar3[uVar12];
      local_40->pNext = (Abc_Obj_t *)0x0;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  qsort(pVVar2->pArray,(long)pVVar2->nSize,8,Vec_VecSortCompare2);
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsNaive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vSupports;
    Vec_Int_t * vSuppI;
    Abc_Obj_t * pObj, * pTemp;
    int i, k;
    // set the PI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // save the CI numbers
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            continue;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vSuppI = (Vec_Int_t *)vSupp;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Vec_IntWriteEntry( vSuppI, k, (int)(ABC_PTRINT_T)pTemp->pNext );
        Vec_IntSort( vSuppI, 0 );
        // append the number of this output
        Vec_IntPush( vSuppI, i );
        // save the support in the vector
        Vec_PtrPush( vSupports, vSuppI );
    }
    // clean the CI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSuppI, i )
        printf( "%d ", Vec_IntSize(vSuppI) );
    printf( "\n" );
*/
    return vSupports;
}